

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::RepeatGreedyLoopNoBacktrackInst::Exec
          (RepeatGreedyLoopNoBacktrackInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  char *pcVar1;
  CharCount CVar2;
  LoopInfo *pLVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  char *pcVar7;
  Program *pPVar8;
  uchar *puVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  uVar11 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  pPVar8 = (matcher->program).ptr;
  if ((ulong)(pPVar8->rep).insts.instsLen < uVar11 + 9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar5) goto LAB_00efaea1;
    *puVar6 = 0;
    pPVar8 = (matcher->program).ptr;
  }
  puVar9 = *(uchar **)&pPVar8->rep;
  if (puVar9[uVar11] != 'P') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar5) goto LAB_00efaea1;
    *puVar6 = 0;
    pPVar8 = (matcher->program).ptr;
    puVar9 = (pPVar8->rep).insts.insts.ptr;
  }
  lVar12 = (long)*(int *)(puVar9 + uVar11 + 1);
  if ((lVar12 < 0) || (pPVar8->numLoops <= *(int *)(puVar9 + uVar11 + 1))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar5) goto LAB_00efaea1;
    *puVar6 = 0;
  }
  pLVar3 = (matcher->loopInfos).ptr;
  pLVar3[lVar12].number = pLVar3[lVar12].number + 1;
  if (*inputOffset == pLVar3[lVar12].startInputOffset) {
    bVar5 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    return bVar5;
  }
  pcVar7 = ContinuousPageStack<1UL>::Top
                     ((ContinuousPageStack<1UL> *)contStack,
                      (contStack->
                      super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                      topElementSize);
  pcVar1 = pcVar7 + 8;
  if (pcVar7 == (char *)0x0) {
    pcVar1 = (char *)0x0;
LAB_00efadb0:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xe9c,"(top != 0 && top->tag == Cont::ContTag::Resume)",
                       "top != 0 && top->tag == Cont::ContTag::Resume");
    if (!bVar5) goto LAB_00efaea1;
    *puVar6 = 0;
  }
  else if (pcVar7[0x10] != '\0') goto LAB_00efadb0;
  CVar2 = *inputOffset;
  *(CharCount *)(pcVar1 + 0xc) = CVar2;
  pLVar3[lVar12].startInputOffset = CVar2;
  uVar10 = (this->super_RepeatLoopMixin).beginLabel + 9;
  pPVar8 = (matcher->program).ptr;
  if ((pPVar8->rep).insts.instsLen <= uVar10) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar5) {
LAB_00efaea1:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
    pPVar8 = (matcher->program).ptr;
  }
  *instPointer = (pPVar8->rep).insts.insts.ptr + uVar10;
  return false;
}

Assistant:

inline bool RepeatGreedyLoopNoBacktrackInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginGreedyLoopNoBacktrackInst* begin = matcher.L2I(BeginGreedyLoopNoBacktrack, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (inputOffset == loopInfo->startInputOffset)
        {
            // No progress
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack, continue from here with no more iterations.
            // Since the loop body is deterministic and group free, it wouldn't have left any continuation records.
            // Therefore we can simply update the Resume continuation still on the top of the stack with the current
            // input pointer.
            Cont* top = contStack.Top();
            Assert(top != 0 && top->tag == Cont::ContTag::Resume);
            ResumeCont* resume = (ResumeCont*)top;
            resume->origInputOffset = inputOffset;

            loopInfo->startInputOffset = inputOffset;
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginGreedyLoopNoBacktrackInst));
        }
        return false;
    }